

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O2

string * __thiscall
CLOptions::operator[](string *__return_storage_ptr__,CLOptions *this,string *param_name)

{
  size_type sVar1;
  size_type sVar2;
  mapped_type *ppCVar3;
  size_type sVar4;
  mapped_type *ppCVar5;
  size_type sVar6;
  mapped_type *ppCVar7;
  ostream *poVar8;
  stringstream param_val;
  string asStack_1c8 [32];
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  sVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>_>
          ::count(&this->params_bools,param_name);
  if (sVar1 == 0) {
    sVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>_>
            ::count(&this->params_doubles,param_name);
    if (sVar2 == 0) {
      sVar4 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>_>
              ::count(&this->params_ints,param_name);
      if (sVar4 == 0) {
        sVar6 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>_>
                ::count(&this->params_strings,param_name);
        if (sVar6 == 0) {
          poVar8 = std::operator<<((ostream *)&std::cerr,"[ERROR] Unknown command line parameter: ")
          ;
          poVar8 = std::operator<<(poVar8,(string *)param_name);
          std::endl<char,std::char_traits<char>>(poVar8);
        }
        else {
          ppCVar7 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>_>
                    ::operator[](&this->params_strings,param_name);
          std::__cxx11::string::string
                    (asStack_1c8,
                     (string *)
                     &((*ppCVar7)->
                      super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ).value);
          std::operator<<(local_198,asStack_1c8);
          std::__cxx11::string::~string(asStack_1c8);
        }
      }
      else {
        ppCVar5 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>_>
                  ::operator[](&this->params_ints,param_name);
        std::ostream::operator<<(local_198,*(int *)(*ppCVar5 + 0x50));
      }
    }
    else {
      ppCVar3 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>_>
                ::operator[](&this->params_doubles,param_name);
      std::ostream::_M_insert<double>(((*ppCVar3)->super_CLParam<double>).value);
    }
  }
  else {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>_>
    ::operator[](&this->params_bools,param_name);
    std::ostream::_M_insert<bool>(SUB81(local_198,0));
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string CLOptions::operator[](std::string param_name)
{
    // Create a default return value of an empty string
    std::stringstream param_val ;
    
    // Loop through the bools
    if (params_bools.count(param_name) > 0) {
        param_val << params_bools[param_name]->getValue() ;
    }
    
    // Loop through the doubles
    else if (params_doubles.count(param_name) > 0) {
        param_val << params_doubles[param_name]->getValue() ;
    }
    
    // Loop through the ints
    else if (params_ints.count(param_name) > 0) {
        param_val << params_ints[param_name]->getValue() ;
    }
    
    // Loop through the strings
    else if (params_strings.count(param_name) > 0) {
        param_val << params_strings[param_name]->getValue() ;
    }
    
    else {
        std::cerr << "[ERROR] Unknown command line parameter: " << param_name << std::endl;
    }
    
    return param_val.str() ;
}